

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::InsertRelCat(SM_Manager *this,char *relName,int attrCount,int recSize)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  RC RVar4;
  char *pData;
  RID relRID;
  
  pData = (char *)malloc(0x34);
  pData[0x30] = '\0';
  pData[0x31] = '\0';
  pData[0x32] = '\0';
  pData[0x33] = '\0';
  uVar1 = *(undefined8 *)(relName + 8);
  uVar2 = *(undefined8 *)(relName + 9);
  uVar3 = *(undefined8 *)(relName + 0x11);
  *(undefined8 *)pData = *(undefined8 *)relName;
  *(undefined8 *)(pData + 8) = uVar1;
  *(undefined8 *)(pData + 9) = uVar2;
  *(undefined8 *)(pData + 0x11) = uVar3;
  *(int *)(pData + 0x1c) = recSize;
  *(int *)(pData + 0x20) = attrCount;
  pData[0x29] = '\0';
  pData[0x2a] = '\0';
  pData[0x2b] = '\0';
  pData[0x2c] = '\0';
  pData[0x2d] = '\0';
  pData[0x2e] = '\0';
  pData[0x2f] = '\0';
  pData[0x30] = '\0';
  pData[0x24] = '\0';
  pData[0x25] = '\0';
  pData[0x26] = '\0';
  pData[0x27] = '\0';
  pData[0x28] = '\0';
  pData[0x29] = '\0';
  pData[0x2a] = '\0';
  pData[0x2b] = '\0';
  RID::RID(&relRID);
  RVar4 = RM_FileHandle::InsertRec(&this->relcatFH,pData,&relRID);
  free(pData);
  RID::~RID(&relRID);
  return RVar4;
}

Assistant:

RC SM_Manager::InsertRelCat(const char *relName, int attrCount, int recSize){
  RC rc = 0;

  RelCatEntry* rEntry = (RelCatEntry *) malloc(sizeof(RelCatEntry));
  memset((void*)rEntry, 0, sizeof(*rEntry));
  *rEntry = (RelCatEntry) {"\0", 0, 0, 0, 0};
  memcpy(rEntry->relName, relName, MAXNAME + 1); // name
  rEntry->tupleLength = recSize;                 // record size
  rEntry->attrCount = attrCount;                 // # of attributes
  rEntry->indexCount = 0;             // starting # of incides
  rEntry->indexCurrNum = 0;           // starting enumeration of indices
  // FOR EX component
  rEntry->numTuples = 0;
  rEntry->statsInitialized = false;

  // Insert into relcat
  RID relRID;
  rc = relcatFH.InsertRec((char *)rEntry, relRID);
  free(rEntry);

  return rc;
}